

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseTableTag(TidyDocImpl *doc,Node *table,GetTokenMode mode)

{
  uint uVar1;
  Lexer *pLVar2;
  TidyParserMemory data;
  ulong uVar3;
  Bool BVar4;
  uint uVar5;
  Node *node;
  Node *pNVar6;
  TidyParserMemory memory;
  
  pLVar2 = doc->lexer;
  if (table == (Node *)0x0) {
    prvTidypopMemory(doc);
    pLVar2->exiled = memory.register_1;
    table = memory.original_node;
  }
  else {
    prvTidyDeferDup(doc);
  }
  uVar1 = pLVar2->istackbase;
  pLVar2->istackbase = pLVar2->istacksize;
  do {
    while( true ) {
      do {
        node = prvTidyGetToken(doc,IgnoreWhitespace);
        if (node == (Node *)0x0) {
          prvTidyReport(doc,table,(Node *)0x0,0x25a);
          pLVar2->istackbase = uVar1;
          return (Node *)0x0;
        }
        if (node->tag == table->tag) {
          if (node->type == EndTag) {
            prvTidyFreeNode(doc,node);
          }
          else {
            prvTidyUngetToken(doc);
            prvTidyReport(doc,table,node,0x27e);
          }
          pLVar2->istackbase = uVar1;
          table->closed = yes;
          return (Node *)0x0;
        }
        BVar4 = InsertMisc(table,node);
      } while (BVar4 != no);
      if (node->tag != (Dict *)0x0) break;
      if (node->type != TextNode) goto LAB_0013bd95;
LAB_0013bce0:
      BVar4 = prvTidynodeIsText(node);
      if ((BVar4 == no) && (BVar4 = prvTidynodeHasCM(node,0x18), BVar4 == no)) {
        if ((node->tag->model & 4) == 0) goto LAB_0013bcb2;
        MoveToHead(doc,table,node);
      }
      else {
        prvTidyInsertNodeBeforeElement(table,node);
        prvTidyReport(doc,table,node,0x27e);
        pLVar2->exiled = yes;
        if (node->type != TextNode) {
          uVar3 = 0;
          goto LAB_0013befa;
        }
        pLVar2->exiled = no;
      }
    }
    if (node->type != EndTag) {
      uVar5 = node->tag->id - TidyTag_TABLE;
      if ((5 < uVar5) || ((0x25U >> (uVar5 & 0x1f) & 1) == 0)) goto LAB_0013bce0;
      prvTidyUngetToken(doc);
      node = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,table,node,0x261);
    }
LAB_0013bcb2:
    if (node->type == EndTag) {
      if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
        BVar4 = prvTidynodeHasCM(node,0x280);
        if ((BVar4 == no) && (BVar4 = prvTidynodeHasCM(node,0x18), pNVar6 = table, BVar4 == no)) {
          while (pNVar6 = pNVar6->parent, pNVar6 != (Node *)0x0) {
            if (node->tag == pNVar6->tag) {
              prvTidyReport(doc,table,node,0x259);
              prvTidyUngetToken(doc);
              goto LAB_0013be7c;
            }
          }
          goto LAB_0013bd77;
        }
      }
      else {
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      }
    }
    else {
LAB_0013bd77:
      if ((node->tag->model & 0x80) == 0) {
        prvTidyUngetToken(doc);
        prvTidyReport(doc,table,node,0x27e);
LAB_0013be7c:
        pLVar2->istackbase = uVar1;
        return (Node *)0x0;
      }
      BVar4 = prvTidynodeIsElement(node);
      if (BVar4 != no) {
        prvTidyInsertNodeAtEnd(table,node);
        uVar3 = (ulong)pLVar2->exiled;
LAB_0013befa:
        memory._32_8_ = uVar3 << 0x20;
        data.original_node = table;
        data.identity = prvTidyParseTableTag;
        data.reentry_node = node;
        data.reentry_mode = IgnoreWhitespace;
        data.reentry_state = 0;
        data.mode = memory.mode;
        data.register_1 = memory.register_1;
        data._40_8_ = 0;
        prvTidypushMemory(doc,data);
        return node;
      }
    }
LAB_0013bd95:
    prvTidyReport(doc,table,node,0x235);
    prvTidyFreeNode(doc,node);
  } while( true );
}

Assistant:

Node* TY_(ParseTableTag)( TidyDocImpl* doc, Node *table, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node, *parent;
    uint istackbase;
    DEBUG_LOG_COUNTERS;

    if ( table == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        table = memory.original_node;
        lexer->exiled = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(table);
        TY_(DeferDup)( doc );
    }

    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        DEBUG_LOG_GOT_TOKEN(node);
        if (node->tag == table->tag )
        {
            if (node->type == EndTag)
            {
                TY_(FreeNode)(doc, node);
            }
            else
            {
                /* Issue #498 - If a <table> in a <table>
                 * just close the current table, and issue a
                 * warning. The previous action was to discard
                 * this second <table>
                 */
                TY_(UngetToken)(doc);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            }
            lexer->istackbase = istackbase;
            table->closed = yes;

            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(table, node))
            continue;

        /* discard unknown tags */
        if (node->tag == NULL && node->type != TextNode)
        {
            TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* if TD or TH or text or inline or block then infer <TR> */

        if (node->type != EndTag)
        {
            if ( nodeIsTD(node) || nodeIsTH(node) || nodeIsTABLE(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_TR);
                TY_(Report)(doc, table, node, MISSING_STARTTAG);
            }
            else if ( TY_(nodeIsText)(node) ||TY_(nodeHasCM)(node,CM_BLOCK|CM_INLINE) )
            {
                TY_(InsertNodeBeforeElement)(table, node);
                TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
                lexer->exiled = yes;

                if (node->type != TextNode)
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseTableTag);
                    memory.original_node = table;
                    memory.reentry_node = node;
                    memory.register_1 = no; /* later, lexer->exiled = no */
                    memory.mode = IgnoreWhitespace;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                lexer->exiled = no;
                continue;
            }
            else if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, table, node);
                continue;
            }
        }

        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* best to discard unexpected block/inline end tags */
            if ( TY_(nodeHasCM)(node, CM_TABLE|CM_ROW) ||
                 TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
            {
                TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = table->parent;
                  parent != NULL;
                  parent = parent->parent )
            {
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, table, node, MISSING_ENDTAG_BEFORE );
                    TY_(UngetToken)( doc );
                    lexer->istackbase = istackbase;

                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }
        }

        if (!(node->tag->model & CM_TABLE))
        {
            TY_(UngetToken)( doc );
            TY_(Report)(doc, table, node, TAG_NOT_ALLOWED_IN);
            lexer->istackbase = istackbase;

            DEBUG_LOG_EXIT;
            return NULL;
        }

        if (TY_(nodeIsElement)(node))
        {
            TidyParserMemory memory = {0};
            TY_(InsertNodeAtEnd)(table, node);
            memory.identity = TY_(ParseTableTag);
            memory.original_node = table;
            memory.reentry_node = node;
            memory.register_1 = lexer->exiled;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, table, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }

    TY_(Report)(doc, table, node, MISSING_ENDTAG_FOR);
    lexer->istackbase = istackbase;

    DEBUG_LOG_EXIT;
    return NULL;
}